

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::Image::GLES2ImageApi::ModifyRenderbufferClearDepth::initializeRbo
          (ModifyRenderbufferClearDepth *this,GLES2ImageApi *api,GLuint renderbuffer,
          Texture2D *reference)

{
  Functions *gl_00;
  glViewportFunc p_Var1;
  int iVar2;
  int iVar3;
  GLenum GVar4;
  deBool dVar5;
  PixelBufferAccess *access;
  Functions *gl;
  Texture2D *reference_local;
  GLuint renderbuffer_local;
  GLES2ImageApi *api_local;
  ModifyRenderbufferClearDepth *this_local;
  
  gl_00 = api->m_gl;
  framebufferRenderbuffer(gl_00,0x8d00,renderbuffer);
  do {
    p_Var1 = gl_00->viewport;
    iVar2 = tcu::Texture2D::getWidth(reference);
    iVar3 = tcu::Texture2D::getHeight(reference);
    (*p_Var1)(0,0,iVar2,iVar3);
    GVar4 = (*gl_00->getError)();
    glu::checkError(GVar4,"viewport(0, 0, reference.getWidth(), reference.getHeight())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x346);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  do {
    (*gl_00->clearDepthf)(this->m_depth);
    GVar4 = (*gl_00->getError)();
    glu::checkError(GVar4,"clearDepthf(m_depth)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x347);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  do {
    (*gl_00->clear)(0x100);
    GVar4 = (*gl_00->getError)();
    glu::checkError(GVar4,"clear(GL_DEPTH_BUFFER_BIT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x348);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  access = tcu::TextureLevelPyramid::getLevel(&reference->super_TextureLevelPyramid,0);
  tcu::clearDepth(access,this->m_depth);
  return;
}

Assistant:

void GLES2ImageApi::ModifyRenderbufferClearDepth::initializeRbo (GLES2ImageApi& api, GLuint renderbuffer, tcu::Texture2D& reference) const
{
	const glw::Functions&	gl		= api.m_gl;

	framebufferRenderbuffer(gl, GL_DEPTH_ATTACHMENT, renderbuffer);

	GLU_CHECK_GLW_CALL(gl, viewport(0, 0, reference.getWidth(), reference.getHeight()));
	GLU_CHECK_GLW_CALL(gl, clearDepthf(m_depth));
	GLU_CHECK_GLW_CALL(gl, clear(GL_DEPTH_BUFFER_BIT));

	tcu::clearDepth(reference.getLevel(0), m_depth);
}